

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

string_t __thiscall
duckdb::Base64DecodeOperator::Operation<duckdb::string_t,duckdb::string_t>
          (Base64DecodeOperator *this,string_t input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  ulong uVar2;
  uchar *puVar3;
  undefined1 auVar4 [16];
  string_t sVar5;
  string_t sVar6;
  string_t result_blob;
  uint local_30;
  undefined4 uStack_2c;
  uchar *local_28;
  
  sVar5.value._8_8_ = input.value._0_8_;
  sVar5.value._0_8_ = this;
  uVar2 = duckdb::Blob::FromBase64Size(sVar5);
  auVar4 = duckdb::StringVector::EmptyString(input.value._8_8_,uVar2);
  local_28 = auVar4._8_8_;
  local_30 = auVar4._0_4_;
  uStack_2c = auVar4._4_4_;
  puVar3 = local_28;
  if (local_30 < 0xd) {
    puVar3 = (uchar *)&uStack_2c;
  }
  sVar6.value.pointer.ptr = (char *)sVar5.value._8_8_;
  sVar6.value._0_8_ = this;
  duckdb::Blob::FromBase64(sVar6,puVar3,uVar2);
  uVar2 = auVar4._0_8_ & 0xffffffff;
  if (uVar2 < 0xd) {
    memset((uchar *)((long)&uStack_2c + uVar2),0,0xc - uVar2);
  }
  else {
    uStack_2c = *(undefined4 *)local_28;
  }
  aVar1._4_1_ = (undefined1)uStack_2c;
  aVar1._5_1_ = uStack_2c._1_1_;
  aVar1._6_1_ = uStack_2c._2_1_;
  aVar1._7_1_ = uStack_2c._3_1_;
  aVar1.pointer.length = local_30;
  aVar1.pointer.ptr = (char *)local_28;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto result_size = Blob::FromBase64Size(input);
		auto result_blob = StringVector::EmptyString(result, result_size);
		Blob::FromBase64(input, data_ptr_cast(result_blob.GetDataWriteable()), result_size);
		result_blob.Finalize();
		return result_blob;
	}